

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2CBus.h
# Opt level: O0

int SetSlaveI2CBus(I2CBUS *pI2CBus,UINT addr,BOOL bTenBit,BOOL bPEC,UINT nbretries,UINT timeout)

{
  int iVar1;
  UINT timeout_local;
  UINT nbretries_local;
  BOOL bPEC_local;
  BOOL bTenBit_local;
  UINT addr_local;
  I2CBUS *pI2CBus_local;
  
  pI2CBus->i2c_addr = addr;
  if (pI2CBus->DevType == 0) {
    pI2CBus_local._4_4_ = SetSlaveComputerI2CBus(pI2CBus->hDev,addr,bTenBit,bPEC,nbretries,timeout);
  }
  else if (pI2CBus->DevType == 1) {
    iVar1 = SetOptionsRS232Port(&pI2CBus->RS232Port,pI2CBus->BaudRate,pI2CBus->ParityMode,
                                pI2CBus->bCheckParity,pI2CBus->nbDataBits,pI2CBus->StopBitsMode,
                                timeout);
    if (iVar1 == 0) {
      pI2CBus_local._4_4_ = 0;
    }
    else {
      pI2CBus_local._4_4_ = 1;
    }
  }
  else {
    pI2CBus_local._4_4_ = 1;
  }
  return pI2CBus_local._4_4_;
}

Assistant:

inline int SetSlaveI2CBus(I2CBUS* pI2CBus, UINT addr, BOOL bTenBit, BOOL bPEC, UINT nbretries, UINT timeout)
{
	pI2CBus->i2c_addr = addr;
	switch (pI2CBus->DevType)
	{
	case LOCAL_TYPE_I2CBUS:
		return SetSlaveComputerI2CBus(pI2CBus->hDev, addr, bTenBit, bPEC, nbretries, timeout);
	case USBISS_TYPE_I2CBUS:
#ifndef NO_TIMEOUT_UPDATE_USBISS_SET_SLAVE_I2CBUS
		if (SetOptionsRS232Port(&pI2CBus->RS232Port, pI2CBus->BaudRate, pI2CBus->ParityMode, pI2CBus->bCheckParity, pI2CBus->nbDataBits, pI2CBus->StopBitsMode, timeout) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_I2CBUS(("SetSlaveI2CBus error (%s) : %s"
				"(pI2CBus=%#x, addr=%u, bTenBit=%u, bPEC=%u, nbretries=%u, timeout=%u)\n",
				strtime_m(),
				"SetOptionsComputerRS232Port failed. ",
				pI2CBus, addr, bTenBit, bPEC, nbretries, timeout));
			return EXIT_FAILURE;
		}
#endif // NO_TIMEOUT_UPDATE_USBISS_SET_SLAVE_I2CBUS
		break;
	default:
		PRINT_DEBUG_ERROR_I2CBUS(("SetSlaveI2CBus error (%s) : %s"
			"(pI2CBus=%#x, addr=%u, bTenBit=%u, bPEC=%u, nbretries=%u, timeout=%u)\n",
			strtime_m(),
			"Invalid device type. ",
			pI2CBus, addr, bTenBit, bPEC, nbretries, timeout));
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}